

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O1

void abuf_add_template(autobuf *out,abuf_template_storage *storage,_Bool keys)

{
  char *pcVar1;
  size_t sVar2;
  size_t len;
  ulong uVar3;
  size_t *psVar4;
  size_t sVar5;
  
  if (storage->count == 0) {
    sVar5 = 0;
  }
  else {
    psVar4 = &storage->indices[0].end;
    sVar5 = 0;
    uVar3 = 0;
    do {
      len = psVar4[-1] - sVar5;
      if (sVar5 <= psVar4[-1] && len != 0) {
        abuf_memcpy(out,storage->format + sVar5,len);
      }
      pcVar1 = (&((abuf_template_storage_entry *)(psVar4 + -2))->data->key)[!keys];
      if (pcVar1 != (char *)0x0) {
        abuf_puts(out,pcVar1);
      }
      sVar5 = *psVar4;
      uVar3 = uVar3 + 1;
      psVar4 = psVar4 + 3;
    } while (uVar3 < storage->count);
  }
  pcVar1 = storage->format;
  sVar2 = strlen(pcVar1);
  if (sVar2 <= sVar5) {
    return;
  }
  abuf_puts(out,pcVar1 + sVar5);
  return;
}

Assistant:

void
abuf_add_template(struct autobuf *out, struct abuf_template_storage *storage, bool keys) {
  struct abuf_template_storage_entry *entry;
  size_t i, last = 0;
  const char *value;

  for (i = 0; i < storage->count; i++) {
    entry = &storage->indices[i];

    /* copy prefix text */
    if (last < entry->start) {
      abuf_memcpy(out, &storage->format[last], entry->start - last);
    }

    if (keys) {
      value = entry->data->key;
    }
    else {
      value = entry->data->value;
    }
    if (value) {
      abuf_puts(out, value);
    }
    last = entry->end;
  }

  if (last < strlen(storage->format)) {
    abuf_puts(out, &storage->format[last]);
  }
}